

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::NavUpdatePageUpPageDown(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImRect *this;
  float fVar3;
  float fVar4;
  float fVar5;
  float nav_scoring_rect_offset_y;
  float page_offset_y;
  ImRect *nav_rect_rel;
  bool end_pressed;
  bool home_pressed;
  bool page_down_held;
  bool page_up_held;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffb0;
  ImGuiNavLayer layer;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 repeat;
  ImGuiKey in_stack_ffffffffffffffc0;
  ImGuiWindow *this_00;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  float local_30;
  float local_4;
  
  pIVar1 = GImGui;
  repeat = (undefined1)((uint)in_stack_ffffffffffffffbc >> 0x18);
  this_00 = GImGui->NavWindow;
  if (((this_00->Flags & 0x40000U) == 0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    layer = (ImGuiNavLayer)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    bVar2 = IsKeyDown(layer);
    local_31 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(layer);
      local_31 = bVar2 ^ 0xff;
    }
    bVar2 = IsKeyDown(layer);
    local_32 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(layer);
      local_32 = bVar2 ^ 0xff;
    }
    bVar2 = IsKeyPressed(in_stack_ffffffffffffffc0,(bool)repeat);
    local_33 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(layer);
      local_33 = bVar2 ^ 0xff;
    }
    local_33 = local_33 & 1;
    bVar2 = IsKeyPressed(in_stack_ffffffffffffffc0,(bool)repeat);
    local_34 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(layer);
      local_34 = bVar2 ^ 0xff;
    }
    local_34 = local_34 & 1;
    if (((local_31 & 1) == (local_32 & 1)) && (local_33 == local_34)) {
      local_4 = 0.0;
    }
    else {
      if (pIVar1->NavLayer != ImGuiNavLayer_Main) {
        NavRestoreLayer(layer);
      }
      if (((this_00->DC).NavLayersActiveMask == 0) && (((this_00->DC).NavHasScroll & 1U) != 0)) {
        bVar2 = IsKeyPressed(in_stack_ffffffffffffffc0,(bool)repeat);
        if (bVar2) {
          fVar4 = (this_00->Scroll).y;
          fVar3 = ImRect::GetHeight(&this_00->InnerRect);
          SetScrollY(this_00,fVar4 - fVar3);
        }
        else {
          bVar2 = IsKeyPressed(in_stack_ffffffffffffffc0,(bool)repeat);
          if (bVar2) {
            fVar4 = (this_00->Scroll).y;
            fVar3 = ImRect::GetHeight(&this_00->InnerRect);
            SetScrollY(this_00,fVar4 + fVar3);
          }
          else if (local_33 == 0) {
            if (local_34 != 0) {
              SetScrollY(this_00,(this_00->ScrollMax).y);
            }
          }
          else {
            SetScrollY(this_00,0.0);
          }
        }
        local_4 = 0.0;
      }
      else {
        this = this_00->NavRectRel + pIVar1->NavLayer;
        fVar4 = ImRect::GetHeight(&this_00->InnerRect);
        fVar3 = ImGuiWindow::CalcFontSize(this_00);
        fVar5 = ImRect::GetHeight(this);
        fVar4 = ImMax<float>(0.0,-fVar3 + fVar4 + fVar5);
        local_30 = 0.0;
        bVar2 = IsKeyPressed(in_stack_ffffffffffffffc0,(bool)repeat);
        if (bVar2) {
          pIVar1->NavMoveDir = 3;
          pIVar1->NavMoveClipDir = 2;
          pIVar1->NavMoveFlags = 0x30;
          local_30 = -fVar4;
        }
        else {
          bVar2 = IsKeyPressed(in_stack_ffffffffffffffc0,(bool)repeat);
          if (bVar2) {
            pIVar1->NavMoveDir = 2;
            pIVar1->NavMoveClipDir = 3;
            pIVar1->NavMoveFlags = 0x30;
            local_30 = fVar4;
          }
          else if (local_33 == 0) {
            if (local_34 != 0) {
              fVar4 = (this_00->ContentSize).y;
              (this->Max).y = fVar4;
              (this->Min).y = fVar4;
              bVar2 = ImRect::IsInverted(this);
              if (bVar2) {
                (this->Max).x = 0.0;
                (this->Min).x = 0.0;
              }
              pIVar1->NavMoveDir = 2;
              pIVar1->NavMoveFlags = 0x50;
            }
          }
          else {
            (this->Max).y = 0.0;
            (this->Min).y = 0.0;
            bVar2 = ImRect::IsInverted(this);
            if (bVar2) {
              (this->Max).x = 0.0;
              (this->Min).x = 0.0;
            }
            pIVar1->NavMoveDir = 3;
            pIVar1->NavMoveFlags = 0x50;
          }
        }
        local_4 = local_30;
      }
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float ImGui::NavUpdatePageUpPageDown()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if ((window->Flags & ImGuiWindowFlags_NoNavInputs) || g.NavWindowingTarget != NULL)
        return 0.0f;

    const bool page_up_held = IsKeyDown(ImGuiKey_PageUp) && !IsActiveIdUsingKey(ImGuiKey_PageUp);
    const bool page_down_held = IsKeyDown(ImGuiKey_PageDown) && !IsActiveIdUsingKey(ImGuiKey_PageDown);
    const bool home_pressed = IsKeyPressed(ImGuiKey_Home) && !IsActiveIdUsingKey(ImGuiKey_Home);
    const bool end_pressed = IsKeyPressed(ImGuiKey_End) && !IsActiveIdUsingKey(ImGuiKey_End);
    if (page_up_held == page_down_held && home_pressed == end_pressed) // Proceed if either (not both) are pressed, otherwise early out
        return 0.0f;

    if (g.NavLayer != ImGuiNavLayer_Main)
        NavRestoreLayer(ImGuiNavLayer_Main);

    if (window->DC.NavLayersActiveMask == 0x00 && window->DC.NavHasScroll)
    {
        // Fallback manual-scroll when window has no navigable item
        if (IsKeyPressed(ImGuiKey_PageUp, true))
            SetScrollY(window, window->Scroll.y - window->InnerRect.GetHeight());
        else if (IsKeyPressed(ImGuiKey_PageDown, true))
            SetScrollY(window, window->Scroll.y + window->InnerRect.GetHeight());
        else if (home_pressed)
            SetScrollY(window, 0.0f);
        else if (end_pressed)
            SetScrollY(window, window->ScrollMax.y);
    }
    else
    {
        ImRect& nav_rect_rel = window->NavRectRel[g.NavLayer];
        const float page_offset_y = ImMax(0.0f, window->InnerRect.GetHeight() - window->CalcFontSize() * 1.0f + nav_rect_rel.GetHeight());
        float nav_scoring_rect_offset_y = 0.0f;
        if (IsKeyPressed(ImGuiKey_PageUp, true))
        {
            nav_scoring_rect_offset_y = -page_offset_y;
            g.NavMoveDir = ImGuiDir_Down; // Because our scoring rect is offset up, we request the down direction (so we can always land on the last item)
            g.NavMoveClipDir = ImGuiDir_Up;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
        }
        else if (IsKeyPressed(ImGuiKey_PageDown, true))
        {
            nav_scoring_rect_offset_y = +page_offset_y;
            g.NavMoveDir = ImGuiDir_Up; // Because our scoring rect is offset down, we request the up direction (so we can always land on the last item)
            g.NavMoveClipDir = ImGuiDir_Down;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
        }
        else if (home_pressed)
        {
            // FIXME-NAV: handling of Home/End is assuming that the top/bottom most item will be visible with Scroll.y == 0/ScrollMax.y
            // Scrolling will be handled via the ImGuiNavMoveFlags_ScrollToEdgeY flag, we don't scroll immediately to avoid scrolling happening before nav result.
            // Preserve current horizontal position if we have any.
            nav_rect_rel.Min.y = nav_rect_rel.Max.y = 0.0f;
            if (nav_rect_rel.IsInverted())
                nav_rect_rel.Min.x = nav_rect_rel.Max.x = 0.0f;
            g.NavMoveDir = ImGuiDir_Down;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_ScrollToEdgeY;
            // FIXME-NAV: MoveClipDir left to _None, intentional?
        }
        else if (end_pressed)
        {
            nav_rect_rel.Min.y = nav_rect_rel.Max.y = window->ContentSize.y;
            if (nav_rect_rel.IsInverted())
                nav_rect_rel.Min.x = nav_rect_rel.Max.x = 0.0f;
            g.NavMoveDir = ImGuiDir_Up;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_ScrollToEdgeY;
            // FIXME-NAV: MoveClipDir left to _None, intentional?
        }
        return nav_scoring_rect_offset_y;
    }
    return 0.0f;
}